

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

void ImportModuleTypes(ExpressionContext *ctx,SynBase *source,ModuleContext *moduleCtx)

{
  ExternMemberInfo *pEVar1;
  uint uniqueId;
  ByteCode *code;
  Allocator *pAVar2;
  char *pcVar3;
  ScopeData *scope;
  double value_00;
  IntrusiveList<MatchData> generics_00;
  IntrusiveList<MatchData> generics_01;
  InplaceStr name;
  InplaceStr name_00;
  InplaceStr name_01;
  InplaceStr typeName_00;
  InplaceStr typeName_01;
  IntrusiveList<TypeHandle> generics_02;
  InplaceStr name_02;
  InplaceStr name_03;
  InplaceStr name_04;
  InplaceStr typeName_02;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  char *symbols_00;
  ExternTypeInfo *pEVar8;
  ExternMemberInfo *pEVar9;
  ExternTypedefInfo *pEVar10;
  ExternTypeInfo *type_00;
  ModuleData **ppMVar11;
  TypeBase **ppTVar12;
  TypeBase *pTVar13;
  NamespaceData **ppNVar14;
  SynIdentifier *pSVar15;
  TypeHandle *this;
  MatchData *pMVar16;
  ParseContext *this_00;
  SynBase *node;
  SynClassDefinition *definition_00;
  TypeGenericClassProto *this_01;
  TypeEnum *this_02;
  TypeStruct *pTVar17;
  TypeClass *pTVar18;
  DelayedType *pDVar19;
  VariableData *pVVar20;
  MemberHandle *pMVar21;
  ConstantData *this_03;
  ulong uVar22;
  ArrayView<InplaceStr> activeImports;
  SynBase *local_798;
  TypeBase *targetType_1;
  SynIdentifier *aliasNameIdentifier_1;
  InplaceStr aliasName_1;
  ExternTypedefInfo *alias_1;
  undefined1 auStack_670 [4];
  uint k_2;
  IntrusiveList<MatchData> aliases;
  uint genericsFound;
  TypeClass *typeClass_1;
  double data;
  ExprBase *value;
  TypeBase *constantType;
  SynIdentifier *memberNameIdentifier_1;
  InplaceStr memberName_1;
  ExternConstantInfo *pEStack_608;
  uint n_1;
  ExternConstantInfo *constantInfo;
  VariableData *member_1;
  TypeBase *memberType;
  ExternMemberInfo *memberInfo;
  SynIdentifier *memberNameIdentifier;
  InplaceStr memberName;
  undefined1 auStack_5b8 [4];
  uint n;
  VariableData *local_5a8;
  VariableData *member;
  TypeClass *typeClass;
  TypeStruct *structType;
  char *memberNames;
  TypeBase *importedType_1;
  InplaceStr typeName_2;
  ExternTypeInfo *type_1;
  DelayedType *delayedType;
  uint i_1;
  TypeClass *classType_2;
  TypeClass *local_540;
  NamespaceData *local_538;
  TypeModulePair local_520;
  TypeClass *local_508;
  MatchData *pMStack_500;
  TypeClass *local_4f8;
  TypeClass *classType_1;
  IntrusiveList<MatchData> actualGenerics_1;
  TypeEnum *enumType;
  SynClassDefinition *definition;
  undefined4 local_4c8;
  ParseContext *local_4c0;
  ParseContext *parser;
  Lexeme *start;
  NamespaceData *local_4a8;
  TypeModulePair local_490;
  MatchData *local_478;
  MatchData *pMStack_470;
  TypeClass *local_460;
  TypeClass *classType;
  TypeGenericClassProto *local_440;
  TypeGenericClassProto *protoClass;
  TypeBase *proto;
  TypeBase *importedType;
  NamespaceData *local_418;
  undefined1 local_408 [8];
  SynIdentifier identifier;
  Lexeme *locationName;
  SynBase *locationSource;
  TypeClass *baseType;
  TypeBase *targetType;
  SynIdentifier *aliasNameIdentifier;
  InplaceStr aliasName;
  ExternTypedefInfo *alias;
  undefined1 auStack_358 [4];
  uint k_1;
  IntrusiveList<MatchData> actualGenerics;
  IntrusiveList<TypeHandle> generics;
  bool isGeneric;
  NamespaceData *pNStack_330;
  uint k;
  NamespaceData *parentNamespace;
  InplaceStr typeName_1;
  TypeBase *prevType;
  TypeClass *forwardDeclaration;
  char *pcStack_300;
  TypeModulePair local_2f0;
  TypeBase **local_2d8;
  TypeBase **prev;
  InplaceStr typeName;
  ModuleData *importModule;
  ExternTypeInfo *type;
  ExternConstantInfo *pEStack_2a8;
  uint i;
  ExternConstantInfo *currentConstant;
  SmallArray<DelayedType,_32U> delayedTypes;
  uint prevSize;
  ExternTypedefInfo *aliasList;
  ExternConstantInfo *constantList;
  ExternMemberInfo *memberList;
  ExternTypeInfo *typeList;
  char *symbols;
  ByteCode *bCode;
  TraceScope traceScope;
  ModuleContext *moduleCtx_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  if ((ImportModuleTypes(ExpressionContext&,SynBase*,ModuleContext&)::token == '\0') &&
     (iVar5 = __cxa_guard_acquire(&ImportModuleTypes(ExpressionContext&,SynBase*,ModuleContext&)::
                                   token), iVar5 != 0)) {
    ImportModuleTypes::token = NULLC::TraceGetToken("analyze","ImportModuleTypes");
    __cxa_guard_release(&ImportModuleTypes(ExpressionContext&,SynBase*,ModuleContext&)::token);
  }
  NULLC::TraceScope::TraceScope((TraceScope *)&bCode,ImportModuleTypes::token);
  code = moduleCtx->data->bytecode;
  symbols_00 = FindSymbols(code);
  pEVar8 = FindFirstType(code);
  pEVar9 = FindFirstMember(code);
  pEStack_2a8 = FindFirstConstant(code);
  pEVar10 = FindFirstTypedef(code);
  delayedTypes.allocator._4_4_ = SmallArray<TypeBase_*,_32U>::size(&moduleCtx->types);
  SmallArray<TypeBase_*,_32U>::resize(&moduleCtx->types,code->typeCount);
  ppTVar12 = (moduleCtx->types).data;
  uVar22 = (ulong)delayedTypes.allocator._4_4_;
  uVar6 = SmallArray<TypeBase_*,_32U>::size(&moduleCtx->types);
  memset(ppTVar12 + uVar22,0,(ulong)(uVar6 - delayedTypes.allocator._4_4_) << 3);
  SmallArray<DelayedType,_32U>::SmallArray
            ((SmallArray<DelayedType,_32U> *)&currentConstant,ctx->allocator);
  type._4_4_ = 0;
  do {
    if (code->typeCount <= type._4_4_) {
      for (delayedType._4_4_ = 0;
          uVar6 = SmallArray<DelayedType,_32U>::size
                            ((SmallArray<DelayedType,_32U> *)&currentConstant),
          delayedType._4_4_ < uVar6; delayedType._4_4_ = delayedType._4_4_ + 1) {
        pDVar19 = SmallArray<DelayedType,_32U>::operator[]
                            ((SmallArray<DelayedType,_32U> *)&currentConstant,delayedType._4_4_);
        typeName_2.end = (char *)(pEVar8 + pDVar19->index);
        if (((ExternTypeInfo *)typeName_2.end)->subCat == CAT_CLASS) {
          InplaceStr::InplaceStr
                    ((InplaceStr *)&importedType_1,
                     symbols_00 + ((ExternTypeInfo *)typeName_2.end)->offsetToName);
          memberNames = (char *)GetImportedModuleTypeAt(ctx,source,moduleCtx,pDVar19->index);
          structType = (TypeStruct *)(CONCAT44(typeName_2.begin._4_4_,(int)typeName_2.begin) + 1);
          typeClass = (TypeClass *)getType<TypeStruct>((TypeBase *)memberNames);
          if (typeClass != (TypeClass *)0x0) {
            ExpressionContext::PushScope(ctx,(TypeBase *)memberNames);
            (typeClass->super_TypeStruct).typeScope = ctx->scope;
            member = (VariableData *)getType<TypeClass>((TypeBase *)typeClass);
            if (((TypeClass *)member != (TypeClass *)0x0) &&
               ((((TypeClass *)member)->extendable & 1U) != 0)) {
              pVVar20 = ExpressionContext::get<VariableData>(ctx);
              pAVar2 = ctx->allocator;
              scope = ctx->scope;
              pTVar13 = ctx->typeTypeID;
              pSVar15 = ExpressionContext::get<SynIdentifier>(ctx);
              InplaceStr::InplaceStr((InplaceStr *)auStack_5b8,"$typeid");
              SynIdentifier::SynIdentifier(pSVar15,_auStack_5b8);
              uVar6 = ctx->uniqueVariableId;
              ctx->uniqueVariableId = uVar6 + 1;
              VariableData::VariableData(pVVar20,pAVar2,source,scope,0,pTVar13,pSVar15,0,uVar6);
              pTVar17 = &typeClass->super_TypeStruct;
              local_5a8 = pVVar20;
              pMVar21 = ExpressionContext::get<MemberHandle>(ctx);
              MemberHandle::MemberHandle(pMVar21,source,local_5a8,(SynBase *)0x0);
              IntrusiveList<MemberHandle>::push_back(&pTVar17->members,pMVar21);
            }
            for (memberName.end._4_4_ = 0; memberName.end._4_4_ < *(uint *)(typeName_2.end + 0x18);
                memberName.end._4_4_ = memberName.end._4_4_ + 1) {
              InplaceStr::InplaceStr((InplaceStr *)&memberNameIdentifier,(char *)structType);
              pSVar15 = ExpressionContext::get<SynIdentifier>(ctx);
              name_01.end = memberName.begin;
              name_01.begin = (char *)memberNameIdentifier;
              SynIdentifier::SynIdentifier(pSVar15,name_01);
              structType = (TypeStruct *)(memberName.begin + 1);
              pEVar1 = pEVar9 + (*(int *)(typeName_2.end + 0x24) + memberName.end._4_4_);
              pTVar13 = GetImportedModuleTypeAt(ctx,source,moduleCtx,pEVar1->type);
              if (pTVar13 == (TypeBase *)0x0) {
                iVar5 = (int)(moduleCtx->data->name).begin;
                anon_unknown.dwarf_6f1cc::Stop
                          (ctx,source,"ERROR: can\'t find member %d type for \'%s\' in module %.*s",
                           (ulong)(memberName.end._4_4_ + 1),symbols_00 + *(uint *)typeName_2.end,
                           (ulong)(uint)(*(int *)&(moduleCtx->data->name).end - iVar5),iVar5);
              }
              pVVar20 = ExpressionContext::get<VariableData>(ctx);
              uVar6 = pEVar1->alignment;
              uVar7 = pEVar1->offset;
              uniqueId = ctx->uniqueVariableId;
              ctx->uniqueVariableId = uniqueId + 1;
              VariableData::VariableData
                        (pVVar20,ctx->allocator,source,ctx->scope,uVar6,pTVar13,pSVar15,uVar7,
                         uniqueId);
              pTVar17 = &typeClass->super_TypeStruct;
              pMVar21 = ExpressionContext::get<MemberHandle>(ctx);
              MemberHandle::MemberHandle(pMVar21,source,pVVar20,(SynBase *)0x0);
              IntrusiveList<MemberHandle>::push_back(&pTVar17->members,pMVar21);
            }
            pEStack_608 = pDVar19->constants;
            for (memberName_1.end._4_4_ = 0;
                memberName_1.end._4_4_ < *(uint *)(typeName_2.end + 0x1c);
                memberName_1.end._4_4_ = memberName_1.end._4_4_ + 1) {
              InplaceStr::InplaceStr((InplaceStr *)&memberNameIdentifier_1,(char *)structType);
              pSVar15 = ExpressionContext::get<SynIdentifier>(ctx);
              name_00.end = memberName_1.begin;
              name_00.begin = (char *)memberNameIdentifier_1;
              SynIdentifier::SynIdentifier(pSVar15,name_00);
              structType = (TypeStruct *)(memberName_1.begin + 1);
              pTVar13 = GetImportedModuleTypeAt(ctx,source,moduleCtx,pEStack_608->type);
              if (pTVar13 == (TypeBase *)0x0) {
                iVar5 = (int)(moduleCtx->data->name).begin;
                anon_unknown.dwarf_6f1cc::Stop
                          (ctx,source,
                           "ERROR: can\'t find constant %d type for \'%s\' in module %.*s",
                           (ulong)(memberName_1.end._4_4_ + 1),symbols_00 + *(uint *)typeName_2.end,
                           (ulong)(uint)(*(int *)&(moduleCtx->data->name).end - iVar5),iVar5);
              }
              data = 0.0;
              if (pTVar13 == ctx->typeBool) {
                data = (double)ExpressionContext::get<ExprBoolLiteral>(ctx);
                ExprBoolLiteral::ExprBoolLiteral
                          ((ExprBoolLiteral *)data,source,pTVar13,pEStack_608->value != 0);
              }
              else {
                bVar4 = ExpressionContext::IsIntegerType(ctx,pTVar13);
                if ((bVar4) || (bVar4 = isType<TypeEnum>(pTVar13), bVar4)) {
                  data = (double)ExpressionContext::get<ExprIntegerLiteral>(ctx);
                  ExprIntegerLiteral::ExprIntegerLiteral
                            ((ExprIntegerLiteral *)data,source,pTVar13,pEStack_608->value);
                }
                else {
                  bVar4 = ExpressionContext::IsFloatingPointType(ctx,pTVar13);
                  if (bVar4) {
                    value_00 = (double)pEStack_608->value;
                    data = (double)ExpressionContext::get<ExprRationalLiteral>(ctx);
                    ExprRationalLiteral::ExprRationalLiteral
                              ((ExprRationalLiteral *)data,source,pTVar13,value_00);
                  }
                }
              }
              if (data == 0.0) {
                anon_unknown.dwarf_6f1cc::Stop
                          (ctx,source,"ERROR: can\'t import constant %d of type \'%.*s\'",
                           (ulong)(memberName_1.end._4_4_ + 1),
                           (ulong)(uint)(*(int *)&(pTVar13->name).end - (int)(pTVar13->name).begin))
                ;
              }
              pTVar17 = &typeClass->super_TypeStruct;
              this_03 = ExpressionContext::get<ConstantData>(ctx);
              ConstantData::ConstantData(this_03,pSVar15,(ExprBase *)data);
              IntrusiveList<ConstantData>::push_back(&pTVar17->constants,this_03);
              pEStack_608 = pEStack_608 + 1;
            }
            ExpressionContext::PopScope(ctx,SCOPE_TYPE);
          }
          pTVar18 = getType<TypeClass>((TypeBase *)memberNames);
          if (pTVar18 != (TypeClass *)0x0) {
            aliases.tail._4_4_ = 0;
            IntrusiveList<MatchData>::IntrusiveList((IntrusiveList<MatchData> *)auStack_670);
            for (alias_1._4_4_ = 0; alias_1._4_4_ < code->typedefCount;
                alias_1._4_4_ = alias_1._4_4_ + 1) {
              aliasName_1.end = (char *)(pEVar10 + alias_1._4_4_);
              if (((ExternTypedefInfo *)aliasName_1.end)->parentType == pDVar19->index) {
                InplaceStr::InplaceStr
                          ((InplaceStr *)&aliasNameIdentifier_1,
                           symbols_00 + ((ExternTypedefInfo *)aliasName_1.end)->offsetToName);
                pSVar15 = ExpressionContext::get<SynIdentifier>(ctx);
                name.end = aliasName_1.begin;
                name.begin = (char *)aliasNameIdentifier_1;
                SynIdentifier::SynIdentifier(pSVar15,name);
                pTVar13 = GetImportedModuleTypeAt
                                    (ctx,source,moduleCtx,*(uint *)(aliasName_1.end + 4));
                if (pTVar13 == (TypeBase *)0x0) {
                  iVar5 = (int)(moduleCtx->data->name).begin;
                  anon_unknown.dwarf_6f1cc::Stop
                            (ctx,source,
                             "ERROR: can\'t find type \'%.*s\' alias \'%s\' target type in module %.*s"
                             ,(ulong)(uint)((int)typeName_2.begin - (int)importedType_1),
                             importedType_1,symbols_00 + *(uint *)aliasName_1.end,
                             *(int *)&(moduleCtx->data->name).end - iVar5,iVar5);
                }
                if (aliases.tail._4_4_ < *(uint *)(typeName_2.end + 0x44)) {
                  aliases.tail._4_4_ = aliases.tail._4_4_ + 1;
                }
                else {
                  pMVar16 = ExpressionContext::get<MatchData>(ctx);
                  MatchData::MatchData(pMVar16,pSVar15,pTVar13);
                  IntrusiveList<MatchData>::push_back
                            ((IntrusiveList<MatchData> *)auStack_670,pMVar16);
                }
              }
            }
            (pTVar18->aliases).head = _auStack_670;
            (pTVar18->aliases).tail = aliases.head;
          }
        }
      }
      SmallArray<DelayedType,_32U>::~SmallArray((SmallArray<DelayedType,_32U> *)&currentConstant);
      NULLC::TraceScope::~TraceScope((TraceScope *)&bCode);
      return;
    }
    type_00 = pEVar8 + type._4_4_;
    typeName.end = (char *)moduleCtx->data;
    if (type_00->definitionModule != 0) {
      ppMVar11 = SmallArray<ModuleData_*,_32U>::operator[]
                           (&moduleCtx->dependencies,type_00->definitionModule - 1);
      typeName.end = (char *)*ppMVar11;
    }
    if ((type_00->typeFlags & 8) == 0) {
LAB_001b924f:
      if (CAT_FUNCTION < type_00->subCat) {
        if (type_00->subCat == CAT_CLASS) {
          prevType = (TypeBase *)0x0;
          pTVar13 = CheckPreviousTypeDefinition
                              (ctx,source,moduleCtx,symbols_00,type_00,(TypeClass **)&prevType);
          typeName_1.end = (char *)pTVar13;
          if (pTVar13 == (TypeBase *)0x0) {
            InplaceStr::InplaceStr
                      ((InplaceStr *)&parentNamespace,symbols_00 + type_00->offsetToName);
            pNStack_330 = (NamespaceData *)0x0;
            for (generics.tail._4_4_ = 0;
                uVar6 = SmallArray<NamespaceData_*,_128U>::size(&ctx->namespaces),
                generics.tail._4_4_ < uVar6; generics.tail._4_4_ = generics.tail._4_4_ + 1) {
              ppNVar14 = SmallArray<NamespaceData_*,_128U>::operator[]
                                   (&ctx->namespaces,generics.tail._4_4_);
              if ((*ppNVar14)->fullNameHash == type_00->namespaceHash) {
                ppNVar14 = SmallArray<NamespaceData_*,_128U>::operator[]
                                     (&ctx->namespaces,generics.tail._4_4_);
                pNStack_330 = *ppNVar14;
                break;
              }
            }
            if (pNStack_330 != (NamespaceData *)0x0) {
              ExpressionContext::PushScope(ctx,pNStack_330);
            }
            generics.tail._3_1_ = 0;
            IntrusiveList<TypeHandle>::IntrusiveList
                      ((IntrusiveList<TypeHandle> *)&actualGenerics.tail);
            IntrusiveList<MatchData>::IntrusiveList((IntrusiveList<MatchData> *)auStack_358);
            for (alias._4_4_ = 0; alias._4_4_ < code->typedefCount; alias._4_4_ = alias._4_4_ + 1) {
              aliasName.end = (char *)(pEVar10 + alias._4_4_);
              if ((((ExternTypedefInfo *)aliasName.end)->parentType == type._4_4_) &&
                 (uVar6 = IntrusiveList<TypeHandle>::size
                                    ((IntrusiveList<TypeHandle> *)&actualGenerics.tail),
                 uVar6 < type_00->genericTypeCount)) {
                InplaceStr::InplaceStr
                          ((InplaceStr *)&aliasNameIdentifier,symbols_00 + *(uint *)aliasName.end);
                pSVar15 = ExpressionContext::get<SynIdentifier>(ctx);
                name_04.end = aliasName.begin;
                name_04.begin = (char *)aliasNameIdentifier;
                SynIdentifier::SynIdentifier(pSVar15,name_04);
                pTVar13 = GetImportedModuleTypeAt(ctx,source,moduleCtx,*(uint *)(aliasName.end + 4))
                ;
                if (pTVar13 == (TypeBase *)0x0) {
                  iVar5 = (int)(moduleCtx->data->name).begin;
                  anon_unknown.dwarf_6f1cc::Stop
                            (ctx,source,
                             "ERROR: can\'t find type \'%.*s\' alias \'%s\' target type in module %.*s"
                             ,(ulong)(uint)((int)typeName_1.begin - (int)parentNamespace),
                             parentNamespace,symbols_00 + *(uint *)aliasName.end,
                             *(int *)&(moduleCtx->data->name).end - iVar5,iVar5);
                }
                generics.tail._3_1_ = generics.tail._3_1_ | pTVar13->isGeneric & 1U;
                this = ExpressionContext::get<TypeHandle>(ctx);
                TypeHandle::TypeHandle(this,pTVar13);
                IntrusiveList<TypeHandle>::push_back
                          ((IntrusiveList<TypeHandle> *)&actualGenerics.tail,this);
                pMVar16 = ExpressionContext::get<MatchData>(ctx);
                MatchData::MatchData(pMVar16,pSVar15,pTVar13);
                IntrusiveList<MatchData>::push_back((IntrusiveList<MatchData> *)auStack_358,pMVar16)
                ;
              }
            }
            locationSource = (SynBase *)0x0;
            if (type_00->baseType != 0) {
              pTVar13 = GetImportedModuleTypeAt(ctx,source,moduleCtx,type_00->baseType);
              locationSource = (SynBase *)getType<TypeClass>(pTVar13);
              if ((TypeClass *)locationSource == (TypeClass *)0x0) {
                iVar5 = (int)(moduleCtx->data->name).begin;
                anon_unknown.dwarf_6f1cc::Stop
                          (ctx,source,"ERROR: can\'t find type \'%.*s\' base type in module %.*s",
                           (ulong)(uint)((int)typeName_1.begin - (int)parentNamespace),
                           parentNamespace,
                           (ulong)(uint)(*(int *)&(moduleCtx->data->name).end - iVar5),iVar5);
              }
            }
            if (*(uint *)(typeName.end + 0x38) <= type_00->definitionLocationStart) {
              __assert_fail("type.definitionLocationStart < importModule->lexStreamSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                            ,0x30ef,
                            "void ImportModuleTypes(ExpressionContext &, SynBase *, ModuleContext &)"
                           );
            }
            if (*(uint *)(typeName.end + 0x38) <= type_00->definitionLocationEnd) {
              __assert_fail("type.definitionLocationEnd < importModule->lexStreamSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                            ,0x30f0,
                            "void ImportModuleTypes(ExpressionContext &, SynBase *, ModuleContext &)"
                           );
            }
            if ((type_00->definitionLocationStart != 0) ||
               (local_798 = source, type_00->definitionLocationEnd != 0)) {
              local_798 = &ExpressionContext::get<SynImportLocation>(ctx)->super_SynBase;
              SynImportLocation::SynImportLocation
                        ((SynImportLocation *)local_798,
                         (Lexeme *)
                         (*(long *)(typeName.end + 0x30) +
                         (ulong)type_00->definitionLocationStart * 0x20),
                         (Lexeme *)
                         (*(long *)(typeName.end + 0x30) +
                         (ulong)type_00->definitionLocationEnd * 0x20));
            }
            if (*(uint *)(typeName.end + 0x38) <= type_00->definitionLocationName) {
              __assert_fail("type.definitionLocationName < importModule->lexStreamSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                            ,0x30f4,
                            "void ImportModuleTypes(ExpressionContext &, SynBase *, ModuleContext &)"
                           );
            }
            identifier.name.end =
                 (char *)(*(long *)(typeName.end + 0x30) +
                         (ulong)type_00->definitionLocationName * 0x20);
            if (type_00->definitionLocationName == 0) {
              name_02.end._4_4_ = typeName_1.begin._4_4_;
              name_02.end._0_4_ = (int)typeName_1.begin;
              importedType = (TypeBase *)parentNamespace;
              name_02.begin = (char *)parentNamespace;
              SynIdentifier::SynIdentifier((SynIdentifier *)local_408,name_02);
            }
            else {
              name_03.end._4_4_ = typeName_1.begin._4_4_;
              name_03.end._0_4_ = (int)typeName_1.begin;
              local_418 = parentNamespace;
              name_03.begin = (char *)parentNamespace;
              SynIdentifier::SynIdentifier
                        ((SynIdentifier *)local_408,(Lexeme *)identifier.name.end,
                         (Lexeme *)identifier.name.end,name_03);
            }
            proto = (TypeBase *)0x0;
            if ((type_00->definitionOffset == 0xffffffff) ||
               ((type_00->definitionOffset & 0x80000000) == 0)) {
              if (type_00->definitionOffsetStart == 0xffffffff) {
                if (type_00->type == TYPE_COMPLEX) {
                  IntrusiveList<MatchData>::IntrusiveList((IntrusiveList<MatchData> *)&classType_1);
                  local_4f8 = (TypeClass *)0x0;
                  if (prevType == (TypeBase *)0x0) {
                    pTVar18 = ExpressionContext::get<TypeClass>(ctx);
                    local_508 = classType_1;
                    pMStack_500 = actualGenerics_1.head;
                    generics_01.tail._0_4_ = (int)actualGenerics_1.head;
                    generics_01.head = (MatchData *)classType_1;
                    generics_01.tail._4_4_ = (int)((ulong)actualGenerics_1.head >> 0x20);
                    TypeClass::TypeClass
                              (pTVar18,ctx->allocator,(SynIdentifier *)local_408,local_798,
                               ctx->scope,(TypeGenericClassProto *)0x0,generics_01,
                               SUB41((type_00->typeFlags & 4) >> 2,0),(TypeClass *)locationSource);
                    local_4f8 = pTVar18;
                  }
                  else {
                    local_4f8 = (TypeClass *)prevType;
                    prevType[2].name.end = (char *)local_798;
                    SynIdentifier::operator=
                              ((SynIdentifier *)&prevType[1].typeIndex,(SynIdentifier *)local_408);
                    local_4f8->scope = ctx->scope;
                    local_4f8->extendable = (type_00->typeFlags & 4) != 0;
                    local_4f8->baseClass = (TypeClass *)locationSource;
                  }
                  if ((type_00->typeFlags & 0x10) != 0) {
                    local_4f8->completed = true;
                  }
                  if ((type_00->typeFlags & 8) != 0) {
                    local_4f8->isInternal = true;
                    typeName_00.end._4_4_ = typeName_1.begin._4_4_;
                    typeName_00.end._0_4_ = (int)typeName_1.begin;
                    local_538 = parentNamespace;
                    typeName_00.begin = (char *)parentNamespace;
                    TypeModulePair::TypeModulePair
                              (&local_520,typeName_00,(ModuleData *)typeName.end);
                    local_540 = local_4f8;
                    SmallDenseMap<TypeModulePair,_TypeBase_*,_TypeModulePairHasher,_32U>::insert
                              (&ctx->internalTypeMap,&local_520,(TypeBase **)&local_540);
                  }
                  proto = (TypeBase *)local_4f8;
                  if (prevType == (TypeBase *)0x0) {
                    ExpressionContext::AddType(ctx,(TypeBase *)local_4f8);
                  }
                }
                else {
                  if (prevType != (TypeBase *)0x0) {
                    __assert_fail("!forwardDeclaration",
                                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                                  ,0x3144,
                                  "void ImportModuleTypes(ExpressionContext &, SynBase *, ModuleContext &)"
                                 );
                  }
                  this_02 = ExpressionContext::get<TypeEnum>(ctx);
                  TypeEnum::TypeEnum(this_02,(SynIdentifier *)local_408,local_798,ctx->scope);
                  actualGenerics_1.tail = (MatchData *)this_02;
                  proto = (TypeBase *)this_02;
                  ExpressionContext::AddType(ctx,(TypeBase *)this_02);
                  bVar4 = IntrusiveList<TypeHandle>::empty
                                    ((IntrusiveList<TypeHandle> *)&actualGenerics.tail);
                  if (!bVar4) {
                    __assert_fail("generics.empty()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                                  ,0x314c,
                                  "void ImportModuleTypes(ExpressionContext &, SynBase *, ModuleContext &)"
                                 );
                  }
                }
              }
              else {
                if (prevType != (TypeBase *)0x0) {
                  __assert_fail("!forwardDeclaration",
                                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                                ,0x312a,
                                "void ImportModuleTypes(ExpressionContext &, SynBase *, ModuleContext &)"
                               );
                }
                if (*(uint *)(typeName.end + 0x38) <= type_00->definitionOffsetStart) {
                  __assert_fail("type.definitionOffsetStart < importModule->lexStreamSize",
                                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                                ,0x312c,
                                "void ImportModuleTypes(ExpressionContext &, SynBase *, ModuleContext &)"
                               );
                }
                parser = (ParseContext *)
                         (*(long *)(typeName.end + 0x30) +
                         (ulong)type_00->definitionOffsetStart * 0x20);
                this_00 = ExpressionContext::get<ParseContext>(ctx);
                pAVar2 = ctx->allocator;
                iVar5 = ctx->optimizationLevel;
                ArrayView<InplaceStr>::ArrayView((ArrayView<InplaceStr> *)&definition);
                activeImports._12_4_ = 0;
                activeImports.data = (InplaceStr *)definition;
                activeImports.count = local_4c8;
                ParseContext::ParseContext(this_00,pAVar2,iVar5,activeImports);
                this_00->currentLexeme = (Lexeme *)parser;
                local_4c0 = this_00;
                ImportModuleNamespaces(this_00,(Lexeme *)parser,*(ByteCode **)(typeName.end + 0x20))
                ;
                node = ParseClassDefinition(local_4c0);
                definition_00 = getType<SynClassDefinition>(node);
                if (definition_00 == (SynClassDefinition *)0x0) {
                  anon_unknown.dwarf_6f1cc::Stop
                            (ctx,source,"ERROR: failed to import generic class body");
                }
                (definition_00->super_SynBase).field_0x3a = 1;
                this_01 = ExpressionContext::get<TypeGenericClassProto>(ctx);
                TypeGenericClassProto::TypeGenericClassProto
                          (this_01,(SynIdentifier *)local_408,local_798,ctx->scope,definition_00);
                proto = &this_01->super_TypeBase;
                ExpressionContext::AddType(ctx,&this_01->super_TypeBase);
              }
            }
            else {
              if (prevType != (TypeBase *)0x0) {
                __assert_fail("!forwardDeclaration",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                              ,0x30fe,
                              "void ImportModuleTypes(ExpressionContext &, SynBase *, ModuleContext &)"
                             );
              }
              protoClass = (TypeGenericClassProto *)
                           GetImportedModuleTypeAt
                                     (ctx,source,moduleCtx,type_00->definitionOffset & 0x7fffffff);
              if (protoClass == (TypeGenericClassProto *)0x0) {
                anon_unknown.dwarf_6f1cc::Stop
                          (ctx,source,"ERROR: can\'t find proto type for \'%s\' in module %.*s",
                           symbols_00 + type_00->offsetToName,
                           (ulong)(uint)(*(int *)&(moduleCtx->data->name).end -
                                        (int)(moduleCtx->data->name).begin));
              }
              local_440 = getType<TypeGenericClassProto>(&protoClass->super_TypeBase);
              if (local_440 == (TypeGenericClassProto *)0x0) {
                anon_unknown.dwarf_6f1cc::Stop
                          (ctx,source,
                           "ERROR: can\'t find correct proto type for \'%s\' in module %.*s",
                           symbols_00 + type_00->offsetToName,
                           (ulong)(uint)(*(int *)&(moduleCtx->data->name).end -
                                        (int)(moduleCtx->data->name).begin));
              }
              if (generics.tail._3_1_ == 0) {
                pTVar18 = ExpressionContext::get<TypeClass>(ctx);
                local_478 = _auStack_358;
                pMStack_470 = actualGenerics.head;
                generics_00.tail._0_4_ = (int)actualGenerics.head;
                generics_00.head = _auStack_358;
                generics_00.tail._4_4_ = (int)((ulong)actualGenerics.head >> 0x20);
                TypeClass::TypeClass
                          (pTVar18,ctx->allocator,(SynIdentifier *)local_408,local_798,ctx->scope,
                           local_440,generics_00,SUB41((type_00->typeFlags & 4) >> 2,0),
                           (TypeClass *)locationSource);
                if ((type_00->typeFlags & 0x10) != 0) {
                  pTVar18->completed = true;
                }
                local_460 = pTVar18;
                if ((type_00->typeFlags & 8) != 0) {
                  pTVar18->isInternal = true;
                  typeName_01.end._4_4_ = typeName_1.begin._4_4_;
                  typeName_01.end._0_4_ = (int)typeName_1.begin;
                  local_4a8 = parentNamespace;
                  typeName_01.begin = (char *)parentNamespace;
                  TypeModulePair::TypeModulePair(&local_490,typeName_01,(ModuleData *)typeName.end);
                  start = (Lexeme *)local_460;
                  SmallDenseMap<TypeModulePair,_TypeBase_*,_TypeModulePairHasher,_32U>::insert
                            (&ctx->internalTypeMap,&local_490,(TypeBase **)&start);
                }
                proto = (TypeBase *)local_460;
                ExpressionContext::AddType(ctx,(TypeBase *)local_460);
                uVar6 = type_00->genericTypeCount;
                uVar7 = IntrusiveList<TypeHandle>::size
                                  ((IntrusiveList<TypeHandle> *)&actualGenerics.tail);
                if (uVar6 != uVar7) {
                  __assert_fail("type.genericTypeCount == generics.size()",
                                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                                ,0x3122,
                                "void ImportModuleTypes(ExpressionContext &, SynBase *, ModuleContext &)"
                               );
                }
                bVar4 = IntrusiveList<TypeHandle>::empty
                                  ((IntrusiveList<TypeHandle> *)&actualGenerics.tail);
                if (!bVar4) {
                  uVar6 = InplaceStr::hash((InplaceStr *)&parentNamespace);
                  HashMap<TypeClass_*>::insert(&ctx->genericTypeMap,uVar6,local_460);
                }
              }
              else {
                classType = (TypeClass *)actualGenerics.tail;
                generics_02.tail = generics.head;
                generics_02.head = (TypeHandle *)actualGenerics.tail;
                proto = &ExpressionContext::GetGenericClassType(ctx,source,local_440,generics_02)->
                         super_TypeBase;
              }
            }
            pTVar13 = proto;
            ppTVar12 = SmallArray<TypeBase_*,_32U>::operator[](&moduleCtx->types,type._4_4_);
            pcVar3 = typeName.end;
            *ppTVar12 = pTVar13;
            ppTVar12 = SmallArray<TypeBase_*,_32U>::operator[](&moduleCtx->types,type._4_4_);
            (*ppTVar12)->importModule = (ModuleData *)pcVar3;
            ppTVar12 = SmallArray<TypeBase_*,_32U>::operator[](&moduleCtx->types,type._4_4_);
            bVar4 = InplaceStr::operator==(&(*ppTVar12)->name,(InplaceStr *)&parentNamespace);
            if (!bVar4) {
              __assert_fail("moduleCtx.types[i]->name == typeName",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                            ,0x3177,
                            "void ImportModuleTypes(ExpressionContext &, SynBase *, ModuleContext &)"
                           );
            }
            proto->alignment = (uint)type_00->defaultAlign;
            proto->size = (ulong)type_00->size;
            proto->hasPointers = type_00->pointerCount != 0;
            pTVar17 = getType<TypeStruct>(proto);
            if (pTVar17 != (TypeStruct *)0x0) {
              DelayedType::DelayedType((DelayedType *)&classType_2,type._4_4_,pEStack_2a8);
              SmallArray<DelayedType,_32U>::push_back
                        ((SmallArray<DelayedType,_32U> *)&currentConstant,
                         (DelayedType *)&classType_2);
              pEStack_2a8 = pEStack_2a8 + type_00->constantCount;
            }
            pTVar18 = getType<TypeClass>(proto);
            if (pTVar18 != (TypeClass *)0x0) {
              pTVar18->hasFinalizer = (type_00->typeFlags & 1) != 0;
            }
            if (pNStack_330 != (NamespaceData *)0x0) {
              ExpressionContext::PopScope(ctx,SCOPE_NAMESPACE);
            }
            SynIdentifier::~SynIdentifier((SynIdentifier *)local_408);
          }
          else {
            ppTVar12 = SmallArray<TypeBase_*,_32U>::operator[](&moduleCtx->types,type._4_4_);
            *ppTVar12 = pTVar13;
            pEStack_2a8 = pEStack_2a8 + type_00->constantCount;
          }
        }
        else {
          pcVar3 = (moduleCtx->data->name).begin;
          anon_unknown.dwarf_6f1cc::Stop
                    (ctx,source,"ERROR: new type in module %.*s named %s unsupported",
                     (ulong)(uint)(*(int *)&(moduleCtx->data->name).end - (int)pcVar3),pcVar3,
                     symbols_00 + type_00->offsetToName);
        }
      }
    }
    else {
      InplaceStr::InplaceStr((InplaceStr *)&prev,symbols_00 + type_00->offsetToName);
      forwardDeclaration = (TypeClass *)prev;
      pcStack_300 = typeName.begin;
      typeName_02.end = typeName.begin;
      typeName_02.begin = (char *)prev;
      TypeModulePair::TypeModulePair(&local_2f0,typeName_02,(ModuleData *)typeName.end);
      local_2d8 = SmallDenseMap<TypeModulePair,_TypeBase_*,_TypeModulePairHasher,_32U>::find
                            (&ctx->internalTypeMap,&local_2f0);
      if (local_2d8 == (TypeBase **)0x0) goto LAB_001b924f;
      pTVar13 = *local_2d8;
      ppTVar12 = SmallArray<TypeBase_*,_32U>::operator[](&moduleCtx->types,type._4_4_);
      *ppTVar12 = pTVar13;
      pEStack_2a8 = pEStack_2a8 + type_00->constantCount;
    }
    type._4_4_ = type._4_4_ + 1;
  } while( true );
}

Assistant:

void ImportModuleTypes(ExpressionContext &ctx, SynBase *source, ModuleContext &moduleCtx)
{
	TRACE_SCOPE("analyze", "ImportModuleTypes");

	ByteCode *bCode = moduleCtx.data->bytecode;
	char *symbols = FindSymbols(bCode);

	// Import types
	ExternTypeInfo *typeList = FindFirstType(bCode);
	ExternMemberInfo *memberList = FindFirstMember(bCode);
	ExternConstantInfo *constantList = FindFirstConstant(bCode);
	ExternTypedefInfo *aliasList = FindFirstTypedef(bCode);

	unsigned prevSize = moduleCtx.types.size();

	moduleCtx.types.resize(bCode->typeCount);

	memset(moduleCtx.types.data + prevSize, 0, (moduleCtx.types.size() - prevSize) * sizeof(moduleCtx.types.data[0]));

	SmallArray<DelayedType, 32> delayedTypes(ctx.allocator);

	ExternConstantInfo *currentConstant = constantList;

	for(unsigned i = 0; i < bCode->typeCount; i++)
	{
		ExternTypeInfo &type = typeList[i];

		ModuleData *importModule = moduleCtx.data;

		if(type.definitionModule != 0)
			importModule = moduleCtx.dependencies[type.definitionModule - 1];

		// Skip internal types if we already imported that module
		if(type.typeFlags & ExternTypeInfo::TYPE_IS_INTERNAL)
		{
			InplaceStr typeName = InplaceStr(symbols + type.offsetToName);

			if(TypeBase **prev = ctx.internalTypeMap.find(TypeModulePair(typeName, importModule)))
			{
				moduleCtx.types[i] = *prev;

				currentConstant += type.constantCount;
				continue;
			}
		}

		switch(type.subCat)
		{
		case ExternTypeInfo::CAT_NONE:
		case ExternTypeInfo::CAT_ARRAY:
		case ExternTypeInfo::CAT_POINTER:
		case ExternTypeInfo::CAT_FUNCTION:
			break;
		case ExternTypeInfo::CAT_CLASS:
			{
				TypeClass *forwardDeclaration = NULL;

				// Skip existing types
				if(TypeBase *prevType = CheckPreviousTypeDefinition(ctx, source, moduleCtx, symbols, type, &forwardDeclaration))
				{
					moduleCtx.types[i] = prevType;

					currentConstant += type.constantCount;
					break;
				}

				InplaceStr typeName = InplaceStr(symbols + type.offsetToName);

				NamespaceData *parentNamespace = NULL;

				for(unsigned k = 0; k < ctx.namespaces.size(); k++)
				{
					if(ctx.namespaces[k]->fullNameHash == type.namespaceHash)
					{
						parentNamespace = ctx.namespaces[k];
						break;
					}
				}

				if(parentNamespace)
					ctx.PushScope(parentNamespace);

				// Find all generics for this type
				bool isGeneric = false;

				IntrusiveList<TypeHandle> generics;
				IntrusiveList<MatchData> actualGenerics;

				for(unsigned k = 0; k < bCode->typedefCount; k++)
				{
					ExternTypedefInfo &alias = aliasList[k];

					if(alias.parentType == i && generics.size() < type.genericTypeCount)
					{
						InplaceStr aliasName = InplaceStr(symbols + alias.offsetToName);

						SynIdentifier *aliasNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(aliasName);

						TypeBase *targetType = GetImportedModuleTypeAt(ctx, source, moduleCtx, alias.targetType);

						if(!targetType)
							Stop(ctx, source, "ERROR: can't find type '%.*s' alias '%s' target type in module %.*s", FMT_ISTR(typeName), symbols + alias.offsetToName, FMT_ISTR(moduleCtx.data->name));

						isGeneric |= targetType->isGeneric;

						generics.push_back(new (ctx.get<TypeHandle>()) TypeHandle(targetType));
						actualGenerics.push_back(new (ctx.get<MatchData>()) MatchData(aliasNameIdentifier, targetType));
					}
				}

				TypeClass *baseType = NULL;

				if(type.baseType)
				{
					baseType = getType<TypeClass>(GetImportedModuleTypeAt(ctx, source, moduleCtx, type.baseType));

					if(!baseType)
						Stop(ctx, source, "ERROR: can't find type '%.*s' base type in module %.*s", FMT_ISTR(typeName), FMT_ISTR(moduleCtx.data->name));
				}

				assert(type.definitionLocationStart < importModule->lexStreamSize);
				assert(type.definitionLocationEnd < importModule->lexStreamSize);
				
				SynBase *locationSource = type.definitionLocationStart != 0 || type.definitionLocationEnd != 0 ? new (ctx.get<SynImportLocation>()) SynImportLocation(type.definitionLocationStart + importModule->lexStream, type.definitionLocationEnd + importModule->lexStream) : source;

				assert(type.definitionLocationName < importModule->lexStreamSize);

				Lexeme *locationName = type.definitionLocationName + importModule->lexStream;

				SynIdentifier identifier = type.definitionLocationName != 0 ? SynIdentifier(locationName, locationName, typeName) : SynIdentifier(typeName);

				TypeBase *importedType = NULL;

				if(type.definitionOffset != ~0u && type.definitionOffset & 0x80000000)
				{
					assert(!forwardDeclaration);

					TypeBase *proto = GetImportedModuleTypeAt(ctx, source, moduleCtx, type.definitionOffset & ~0x80000000);

					if(!proto)
						Stop(ctx, source, "ERROR: can't find proto type for '%s' in module %.*s", symbols + type.offsetToName, FMT_ISTR(moduleCtx.data->name));

					TypeGenericClassProto *protoClass = getType<TypeGenericClassProto>(proto);

					if(!protoClass)
						Stop(ctx, source, "ERROR: can't find correct proto type for '%s' in module %.*s", symbols + type.offsetToName, FMT_ISTR(moduleCtx.data->name));

					if(isGeneric)
					{
						importedType = ctx.GetGenericClassType(source, protoClass, generics);

						// TODO: assert that alias list is empty and that correct number of generics was exported
					}
					else
					{
						TypeClass *classType = new (ctx.get<TypeClass>()) TypeClass(ctx.allocator, identifier, locationSource, ctx.scope, protoClass, actualGenerics, (type.typeFlags & ExternTypeInfo::TYPE_IS_EXTENDABLE) != 0, baseType);

						if(type.typeFlags & ExternTypeInfo::TYPE_IS_COMPLETED)
							classType->completed = true;

						if(type.typeFlags & ExternTypeInfo::TYPE_IS_INTERNAL)
						{
							classType->isInternal = true;

							ctx.internalTypeMap.insert(TypeModulePair(typeName, importModule), classType);
						}

						importedType = classType;

						ctx.AddType(importedType);

						assert(type.genericTypeCount == generics.size());

						if(!generics.empty())
							ctx.genericTypeMap.insert(typeName.hash(), classType);
					}
				}
				else if(type.definitionOffsetStart != ~0u)
				{
					assert(!forwardDeclaration);

					assert(type.definitionOffsetStart < importModule->lexStreamSize);
					Lexeme *start = type.definitionOffsetStart + importModule->lexStream;

					ParseContext *parser = new (ctx.get<ParseContext>()) ParseContext(ctx.allocator, ctx.optimizationLevel, ArrayView<InplaceStr>());

					parser->currentLexeme = start;

					ImportModuleNamespaces(*parser, start, importModule->bytecode);

					SynClassDefinition *definition = getType<SynClassDefinition>(ParseClassDefinition(*parser));

					if(!definition)
						Stop(ctx, source, "ERROR: failed to import generic class body");

					definition->imported = true;

					importedType = new (ctx.get<TypeGenericClassProto>()) TypeGenericClassProto(identifier, locationSource, ctx.scope, definition);

					ctx.AddType(importedType);

					// TODO: check that type doesn't have generics or aliases
				}
				else if(type.type != ExternTypeInfo::TYPE_COMPLEX)
				{
					assert(!forwardDeclaration);

					TypeEnum *enumType = new (ctx.get<TypeEnum>()) TypeEnum(identifier, locationSource, ctx.scope);

					importedType = enumType;

					ctx.AddType(importedType);

					assert(generics.empty());
				}
				else
				{
					IntrusiveList<MatchData> actualGenerics;

					TypeClass *classType = NULL;

					if(forwardDeclaration)
					{
						classType = forwardDeclaration;

						classType->source = locationSource;
						classType->identifier = identifier;
						classType->scope = ctx.scope;
						classType->extendable = (type.typeFlags & ExternTypeInfo::TYPE_IS_EXTENDABLE) != 0;
						classType->baseClass = baseType;
					}
					else
					{
						classType = new (ctx.get<TypeClass>()) TypeClass(ctx.allocator, identifier, locationSource, ctx.scope, NULL, actualGenerics, (type.typeFlags & ExternTypeInfo::TYPE_IS_EXTENDABLE) != 0, baseType);
					}

					if(type.typeFlags & ExternTypeInfo::TYPE_IS_COMPLETED)
						classType->completed = true;

					if(type.typeFlags & ExternTypeInfo::TYPE_IS_INTERNAL)
					{
						classType->isInternal = true;

						ctx.internalTypeMap.insert(TypeModulePair(typeName, importModule), classType);
					}

					importedType = classType;

					if(!forwardDeclaration)
						ctx.AddType(importedType);
				}

				moduleCtx.types[i] = importedType;

				moduleCtx.types[i]->importModule = importModule;

				assert(moduleCtx.types[i]->name == typeName);

				importedType->alignment = type.defaultAlign;
				importedType->size = type.size;

				importedType->hasPointers = type.pointerCount != 0;

				if(getType<TypeStruct>(importedType))
				{
					delayedTypes.push_back(DelayedType(i, currentConstant));

					currentConstant += type.constantCount;
				}

				if(TypeClass *classType = getType<TypeClass>(importedType))
					classType->hasFinalizer = type.typeFlags & ExternTypeInfo::TYPE_HAS_FINALIZER;

				if(parentNamespace)
					ctx.PopScope(SCOPE_NAMESPACE);
			}
			break;
		default:
			Stop(ctx, source, "ERROR: new type in module %.*s named %s unsupported", FMT_ISTR(moduleCtx.data->name), symbols + type.offsetToName);
		}
	}

	for(unsigned i = 0; i < delayedTypes.size(); i++)
	{
		DelayedType &delayedType = delayedTypes[i];
		ExternTypeInfo &type = typeList[delayedType.index];

		switch(type.subCat)
		{
		case ExternTypeInfo::CAT_CLASS:
			{
				InplaceStr typeName = InplaceStr(symbols + type.offsetToName);

				TypeBase *importedType = GetImportedModuleTypeAt(ctx, source, moduleCtx, delayedType.index);

				const char *memberNames = typeName.end + 1;

				if(TypeStruct *structType = getType<TypeStruct>(importedType))
				{
					ctx.PushScope(importedType);

					structType->typeScope = ctx.scope;

					if(TypeClass *typeClass = getType<TypeClass>(structType))
					{
						if(typeClass->extendable)
						{
							// TODO: apart from LLVM failure, were there any issues with this member missing?
							VariableData *member = new (ctx.get<VariableData>()) VariableData(ctx.allocator, source, ctx.scope, 0, ctx.typeTypeID, new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("$typeid")), 0, ctx.uniqueVariableId++);

							structType->members.push_back(new (ctx.get<MemberHandle>()) MemberHandle(source, member, NULL));
						}
					}

					for(unsigned n = 0; n < type.memberCount; n++)
					{
						InplaceStr memberName = InplaceStr(memberNames);

						SynIdentifier *memberNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(memberName);

						memberNames = memberName.end + 1;

						ExternMemberInfo &memberInfo = memberList[type.memberOffset + n];

						TypeBase *memberType = GetImportedModuleTypeAt(ctx, source, moduleCtx, memberInfo.type);

						if(!memberType)
							Stop(ctx, source, "ERROR: can't find member %d type for '%s' in module %.*s", n + 1, symbols + type.offsetToName, FMT_ISTR(moduleCtx.data->name));

						VariableData *member = new (ctx.get<VariableData>()) VariableData(ctx.allocator, source, ctx.scope, memberInfo.alignment, memberType, memberNameIdentifier, memberInfo.offset, ctx.uniqueVariableId++);

						structType->members.push_back(new (ctx.get<MemberHandle>()) MemberHandle(source, member, NULL));
					}

					ExternConstantInfo *constantInfo = delayedType.constants;

					for(unsigned int n = 0; n < type.constantCount; n++)
					{
						InplaceStr memberName = InplaceStr(memberNames);

						SynIdentifier *memberNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(memberName);

						memberNames = memberName.end + 1;

						TypeBase *constantType = GetImportedModuleTypeAt(ctx, source, moduleCtx, constantInfo->type);

						if(!constantType)
							Stop(ctx, source, "ERROR: can't find constant %d type for '%s' in module %.*s", n + 1, symbols + type.offsetToName, FMT_ISTR(moduleCtx.data->name));

						ExprBase *value = NULL;

						if(constantType == ctx.typeBool)
						{
							value = new (ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, constantType, constantInfo->value != 0);
						}
						else if(ctx.IsIntegerType(constantType) || isType<TypeEnum>(constantType))
						{
							value = new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, constantType, constantInfo->value);
						}
						else if(ctx.IsFloatingPointType(constantType))
						{
							double data = 0.0;
							memcpy(&data, &constantInfo->value, sizeof(double));
							value = new (ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(source, constantType, data);
						}
							
						if(!value)
							Stop(ctx, source, "ERROR: can't import constant %d of type '%.*s'", n + 1, FMT_ISTR(constantType->name));

						structType->constants.push_back(new (ctx.get<ConstantData>()) ConstantData(memberNameIdentifier, value));

						constantInfo++;
					}

					ctx.PopScope(SCOPE_TYPE);
				}

				if(TypeClass *typeClass = getType<TypeClass>(importedType))
				{
					unsigned genericsFound = 0;

					IntrusiveList<MatchData> aliases;

					for(unsigned k = 0; k < bCode->typedefCount; k++)
					{
						ExternTypedefInfo &alias = aliasList[k];

						if(alias.parentType == delayedType.index)
						{
							InplaceStr aliasName = InplaceStr(symbols + alias.offsetToName);

							SynIdentifier *aliasNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(aliasName);

							TypeBase *targetType = GetImportedModuleTypeAt(ctx, source, moduleCtx, alias.targetType);

							if(!targetType)
								Stop(ctx, source, "ERROR: can't find type '%.*s' alias '%s' target type in module %.*s", FMT_ISTR(typeName), symbols + alias.offsetToName, FMT_ISTR(moduleCtx.data->name));

							if(genericsFound < type.genericTypeCount)
								genericsFound++;
							else
								aliases.push_back(new (ctx.get<MatchData>()) MatchData(aliasNameIdentifier, targetType));
						}
					}

					typeClass->aliases = aliases;
				}
			}
			break;
		default:
			break;
		}
	}
}